

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall
Highs::getColsInterface
          (Highs *this,HighsIndexCollection *index_collection,HighsInt *num_col,double *cost,
          double *lower,double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value
          )

{
  bool bVar1;
  HighsInt *sub_matrix_num_nz;
  double *sub_vector_data1;
  double *sub_vector_data2;
  double *in_RCX;
  HighsInt *in_RSI;
  long in_RDI;
  HighsInt *in_R8;
  HighsInt *in_R9;
  HighsSparseMatrix *in_stack_00000008;
  double *in_stack_00000010;
  HighsSparseMatrix *in_stack_00000018;
  double *in_stack_00000020;
  HighsInt in_stack_0000002c;
  HighsIndexCollection *in_stack_00000030;
  HighsInt *in_stack_00000040;
  double *in_stack_00000048;
  double *in_stack_00000050;
  double *in_stack_00000058;
  HighsInt *in_stack_00000060;
  HighsInt *in_stack_00000068;
  HighsInt *in_stack_00000070;
  double *in_stack_00000078;
  HighsLp *lp;
  double *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  HighsInt in_stack_ffffffffffffff6c;
  HighsIndexCollection *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  HighsInt HVar2;
  
  sub_matrix_num_nz = (HighsInt *)(in_RDI + 0x138);
  bVar1 = HighsSparseMatrix::isColwise((HighsSparseMatrix *)(in_RDI + 0x1b8));
  if (bVar1) {
    HVar2 = *sub_matrix_num_nz;
    sub_vector_data1 =
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x4daacf);
    sub_vector_data2 =
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x4daae5);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4daafe);
    getSubVectors(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                  in_stack_ffffffffffffff58,in_stack_00000020,in_stack_00000018,in_RSI,
                  (double *)CONCAT44(HVar2,in_stack_ffffffffffffff88),sub_vector_data1,
                  sub_vector_data2,sub_matrix_num_nz,in_R9,in_R8,in_RCX);
  }
  else {
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dabc3);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dabd9);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dabef);
    getSubVectorsTranspose
              (in_stack_00000030,in_stack_0000002c,in_stack_00000020,(double *)in_stack_00000018,
               in_stack_00000010,in_stack_00000008,in_stack_00000040,in_stack_00000048,
               in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
               in_stack_00000070,in_stack_00000078);
  }
  return;
}

Assistant:

void Highs::getColsInterface(const HighsIndexCollection& index_collection,
                             HighsInt& num_col, double* cost, double* lower,
                             double* upper, HighsInt& num_nz, HighsInt* start,
                             HighsInt* index, double* value) const {
  const HighsLp& lp = model_.lp_;
  if (lp.a_matrix_.isColwise()) {
    getSubVectors(index_collection, lp.num_col_, lp.col_cost_.data(),
                  lp.col_lower_.data(), lp.col_upper_.data(), lp.a_matrix_,
                  num_col, cost, lower, upper, num_nz, start, index, value);
  } else {
    getSubVectorsTranspose(index_collection, lp.num_col_, lp.col_cost_.data(),
                           lp.col_lower_.data(), lp.col_upper_.data(),
                           lp.a_matrix_, num_col, cost, lower, upper, num_nz,
                           start, index, value);
  }
}